

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>,void>
               (vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                *container,ostream *os)

{
  pointer psVar1;
  long lVar2;
  pointer ptr;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  ptr = (container->
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (container->
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptr != psVar1) {
    lVar2 = 0;
    do {
      if ((lVar2 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar2 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_00210399;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      PrintSmartPointer<bssl::ParsedCertificate_const,std::shared_ptr<bssl::ParsedCertificate_const>,void>
                (ptr,os,0);
      lVar2 = lVar2 + 1;
      ptr = ptr + 1;
    } while (ptr != psVar1);
    if (lVar2 != 0) {
LAB_00210399:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }